

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_standard_midi.cpp
# Opt level: O0

void midi_processor::process_standard_midi_track
               (const_iterator *it,const_iterator end,midi_container *p_out,bool is_gmf)

{
  byte bVar1;
  uchar uVar2;
  bool bVar3;
  uint uVar4;
  byte *pbVar5;
  ulong uVar6;
  reference puVar7;
  difference_type dVar8;
  reference pvVar9;
  midi_event local_330;
  midi_event local_2f0;
  midi_event local_2b0;
  uchar *local_270;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_268;
  uchar *local_260;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_258;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_250;
  const_iterator *local_248;
  int local_23c;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_238;
  int data_count_2;
  uchar local_229;
  undefined1 local_228 [7];
  uchar meta_type;
  uchar *local_1e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e0;
  uchar *local_1d8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c8;
  const_iterator *local_1c0;
  int local_1b4;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_1b0;
  int data_count_1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a8;
  uchar *local_1a0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_198;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_190;
  const_iterator *local_188;
  int local_17c;
  undefined1 local_178 [4];
  int data_count;
  midi_event local_138;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f8;
  byte local_e9;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_e8;
  bool command_valid;
  midi_event local_e0;
  uint local_9c;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_98;
  uint data_bytes_read;
  byte local_89;
  const_iterator *pcStack_88;
  uchar event_code;
  int local_80;
  int delta;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  uint local_50;
  uint last_sysex_timestamp;
  uint last_sysex_length;
  uint uStack_44;
  uchar last_event_code;
  uint last_event_timestamp;
  uint current_timestamp;
  midi_track track;
  bool needs_end_marker;
  bool is_gmf_local;
  midi_container *p_out_local;
  const_iterator *it_local;
  const_iterator end_local;
  
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = is_gmf;
  it_local = (const_iterator *)end._M_current;
  midi_track::midi_track((midi_track *)&last_event_timestamp);
  uStack_44 = 0;
  last_sysex_length = 0;
  last_sysex_timestamp._3_1_ = 0xff;
  local_50 = 0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,3);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            if (((track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) &&
               (bVar3 = __gnu_cxx::operator==
                                  (it,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)&it_local), bVar3)) goto LAB_0012d371;
            pcStack_88 = it_local;
            local_80 = decode_delta(it,(const_iterator)it_local);
            if (((track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) &&
               (bVar3 = __gnu_cxx::operator==
                                  (it,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)&it_local), bVar3)) goto LAB_0012d371;
            if (local_80 < 0) {
              local_80 = -local_80;
            }
            if (1000000 < local_80) goto LAB_0012d371;
            uStack_44 = local_80 + uStack_44;
            bVar3 = __gnu_cxx::operator==
                              (it,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)&it_local);
            if (bVar3) goto LAB_0012d371;
            _Stack_98 = __gnu_cxx::
                        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator++(it,0);
            pbVar5 = __gnu_cxx::
                     __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator*(&stack0xffffffffffffff68);
            bVar1 = *pbVar5;
            local_9c = 0;
            local_89 = bVar1;
            if (bVar1 < 0x80) {
              if (last_sysex_timestamp._3_1_ == 0xff) goto LAB_0012d371;
              local_9c = 1;
              pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
                                  0);
              *pbVar5 = bVar1;
              local_89 = last_sysex_timestamp._3_1_;
            }
            bVar1 = local_89;
            if (0xef < local_89) break;
            if (local_50 != 0) {
              uVar6 = (ulong)buffer.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              last_sysex_length =
                   buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
              pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
                                  0);
              midi_event::midi_event(&local_e0,uVar6,extended,0,pvVar9,(ulong)local_50);
              midi_track::add_event((midi_track *)&last_event_timestamp,&local_e0);
              midi_event::~midi_event(&local_e0);
              local_50 = 0;
            }
            last_sysex_timestamp._3_1_ = local_89;
            if (((track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) ||
               ((local_89 & 0xf0) != 0xe0)) {
              if (local_9c == 0) {
                bVar3 = __gnu_cxx::operator==
                                  (it,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)&it_local);
                if (bVar3) goto LAB_0012d371;
                _Stack_e8 = __gnu_cxx::
                            __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::operator++(it,0);
                puVar7 = __gnu_cxx::
                         __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator*(&stack0xffffffffffffff18);
                uVar2 = *puVar7;
                pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_70,0);
                *pvVar9 = uVar2;
                local_9c = local_9c + 1;
              }
              local_e9 = 1;
              if ((local_89 & 0xf0 | 0x10) != 0xd0) {
                bVar3 = __gnu_cxx::operator==
                                  (it,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                       *)&it_local);
                if (bVar3) {
                  local_e9 = 0;
                }
                else {
                  local_f8 = __gnu_cxx::
                             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator++(it,0);
                  puVar7 = __gnu_cxx::
                           __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ::operator*(&local_f8);
                  uVar2 = *puVar7;
                  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_70,(ulong)local_9c);
                  *pvVar9 = uVar2;
                  local_9c = local_9c + 1;
                }
              }
              if ((local_e9 & 1) == 0) goto LAB_0012d371;
              uVar4 = (uint)local_89;
              bVar1 = local_89 >> 4;
              pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
                                  0);
              midi_event::midi_event
                        (&local_138,(ulong)uStack_44,bVar1 + ~extended,uVar4 & 0xf,pvVar9,
                         (ulong)local_9c);
              midi_track::add_event((midi_track *)&last_event_timestamp,&local_138);
              midi_event::~midi_event(&local_138);
              last_sysex_length = uStack_44;
            }
          }
          if (local_89 != 0xf0) break;
          if (local_50 != 0) {
            uVar6 = (ulong)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            last_sysex_length =
                 buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
            pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0)
            ;
            midi_event::midi_event((midi_event *)local_178,uVar6,extended,0,pvVar9,(ulong)local_50);
            midi_track::add_event((midi_track *)&last_event_timestamp,(midi_event *)local_178);
            midi_event::~midi_event((midi_event *)local_178);
          }
          bVar3 = __gnu_cxx::operator==
                            (it,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)&it_local);
          if (bVar3) goto LAB_0012d371;
          local_188 = it_local;
          local_17c = decode_delta(it,(const_iterator)it_local);
          if ((local_17c < 0) ||
             (dVar8 = __gnu_cxx::operator-
                                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)&it_local,it), dVar8 < local_17c)) goto LAB_0012d371;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
                     (long)(local_17c + 1));
          pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
          *pvVar9 = 0xf0;
          local_190._M_current = it->_M_current;
          local_198 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(it,(long)local_17c);
          local_1a8._M_current =
               (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70
                                  );
          local_1a0 = (uchar *)__gnu_cxx::
                               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               ::operator+(&local_1a8,1);
          _Stack_1b0 = std::
                       copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                 (local_190,local_198,
                                  (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   )local_1a0);
          __gnu_cxx::
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator+=(it,(long)local_17c);
          local_50 = local_17c + 1;
          buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = uStack_44;
        }
        if (local_89 != 0xf7) break;
        if ((local_50 == 0) ||
           (bVar3 = __gnu_cxx::operator==
                              (it,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)&it_local), bVar3)) goto LAB_0012d371;
        local_1c0 = it_local;
        local_1b4 = decode_delta(it,(const_iterator)it_local);
        if ((local_1b4 < 0) ||
           (dVar8 = __gnu_cxx::operator-
                              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&it_local,it), dVar8 < local_1b4)) goto LAB_0012d371;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
                   (ulong)(local_50 + local_1b4));
        local_1c8._M_current = it->_M_current;
        local_1d0 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(it,(long)local_1b4);
        local_1e0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
        local_1d8 = (uchar *)__gnu_cxx::
                             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator+(&local_1e0,(ulong)local_50);
        local_1e8 = (uchar *)std::
                             copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                       (local_1c8,local_1d0,
                                        (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         )local_1d8);
        __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator+=(it,(long)local_1b4);
        local_50 = local_1b4 + local_50;
      }
      if (local_89 == 0xff) break;
      if ((local_89 < 0xf8) || (0xfe < local_89)) goto LAB_0012d371;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
      *pbVar5 = bVar1;
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
      midi_event::midi_event(&local_2f0,(ulong)uStack_44,extended,0,pvVar9,1);
      midi_track::add_event((midi_track *)&last_event_timestamp,&local_2f0);
      midi_event::~midi_event(&local_2f0);
      last_sysex_length = uStack_44;
    }
    if (local_50 != 0) {
      uVar6 = (ulong)buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      last_sysex_length =
           buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
      midi_event::midi_event((midi_event *)local_228,uVar6,extended,0,pvVar9,(ulong)local_50);
      midi_track::add_event((midi_track *)&last_event_timestamp,(midi_event *)local_228);
      midi_event::~midi_event((midi_event *)local_228);
      local_50 = 0;
    }
    bVar3 = __gnu_cxx::operator==
                      (it,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&it_local);
    if (bVar3) goto LAB_0012d371;
    _Stack_238 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator++(it,0);
    puVar7 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&stack0xfffffffffffffdc8);
    local_229 = *puVar7;
    bVar3 = __gnu_cxx::operator==
                      (it,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&it_local);
    if (bVar3) goto LAB_0012d371;
    local_248 = it_local;
    local_23c = decode_delta(it,(const_iterator)it_local);
    if ((local_23c < 0) ||
       (dVar8 = __gnu_cxx::operator-
                          ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&it_local,it), dVar8 < local_23c)) goto LAB_0012d371;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
               (long)(local_23c + 2));
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
    uVar2 = local_229;
    *pvVar9 = 0xff;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,1);
    *pvVar9 = uVar2;
    local_250._M_current = it->_M_current;
    local_258 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(it,(long)local_23c);
    local_268._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
    local_260 = (uchar *)__gnu_cxx::
                         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_268,2);
    local_270 = (uchar *)std::
                         copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                   (local_250,local_258,
                                    (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                     )local_260);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+=(it,(long)local_23c);
    if (local_229 == '/') {
      uStack_44 = last_sysex_length;
    }
    last_sysex_length = uStack_44;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
    midi_event::midi_event
              (&local_2b0,(ulong)last_sysex_length,extended,0,pvVar9,(long)(local_23c + 2));
    midi_track::add_event((midi_track *)&last_event_timestamp,&local_2b0);
    midi_event::~midi_event(&local_2b0);
    uStack_44 = last_sysex_length;
  } while (local_229 != '/');
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
LAB_0012d371:
  if ((track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._6_1_ & 1) == 0) {
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
    *pvVar9 = 0xff;
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,1);
    *pvVar9 = '/';
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,0);
    midi_event::midi_event(&local_330,(ulong)last_sysex_length,extended,0,pvVar9,2);
    midi_track::add_event((midi_track *)&last_event_timestamp,&local_330);
    midi_event::~midi_event(&local_330);
  }
  midi_container::add_track(p_out,(midi_track *)&last_event_timestamp);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  midi_track::~midi_track((midi_track *)&last_event_timestamp);
  return;
}

Assistant:

void midi_processor::process_standard_midi_track( std::vector<uint8_t>::const_iterator & it, std::vector<uint8_t>::const_iterator end, midi_container & p_out, bool is_gmf )
{
    bool needs_end_marker = false;

    midi_track track;
    unsigned current_timestamp = 0;
    unsigned last_event_timestamp = 0;
    unsigned char last_event_code = 0xFF;

    unsigned last_sysex_length = 0;
    unsigned last_sysex_timestamp = 0;

    std::vector<uint8_t> buffer;
    buffer.resize( 3 );

    for (;;)
    {
        if ( !needs_end_marker && it == end ) break;
        int delta = decode_delta( it, end );
        if ( !needs_end_marker && it == end ) break;

        if ( delta < 0 )
        {
            /*"MIDI processor encountered negative delta: " << delta << "; flipping sign.";*/
            delta = -delta;
        }
        
        if ( delta > 1000000 )
            break;

        current_timestamp += delta;
        if ( it == end ) break;
        unsigned char event_code = *it++;
        unsigned data_bytes_read = 0;
        if ( event_code < 0x80 )
        {
            if ( last_event_code == 0xFF ) break; /*throw exception_io_data("First MIDI track event short encoded");*/
            buffer[ data_bytes_read++ ] = event_code;
            event_code = last_event_code;
        }
        if ( event_code < 0xF0 )
        {
            if ( last_sysex_length )
            {
                track.add_event( midi_event( last_event_timestamp = last_sysex_timestamp, midi_event::extended, 0, &buffer[0], last_sysex_length ) );
                last_sysex_length = 0;
            }

            last_event_code = event_code;
            if ( is_gmf && ( event_code & 0xF0 ) == 0xE0 ) continue;
            if ( data_bytes_read < 1 )
            {
                if ( it == end ) break;
                buffer[ 0 ] = *it++;
                ++data_bytes_read;
            }
            bool command_valid = true;
            switch ( event_code & 0xF0 )
            {
            case 0xC0:
            case 0xD0:
                break;
            default:
                if ( it == end )
                {
                    command_valid = false;
                    break;
                }
                buffer[ data_bytes_read ] = *it++;
                ++data_bytes_read;
            }
            if ( !command_valid ) break;
            track.add_event( midi_event( last_event_timestamp = current_timestamp, (midi_event::event_type)(( event_code >> 4 ) - 8), event_code & 0x0F, &buffer[0], data_bytes_read ) );
        }
        else if ( event_code == 0xF0 )
        {
            if ( last_sysex_length )
            {
                track.add_event( midi_event( last_event_timestamp = last_sysex_timestamp, midi_event::extended, 0, &buffer[0], last_sysex_length ) );
                last_sysex_length = 0;
            }

            if ( it == end ) break;
            int data_count = decode_delta( it, end );
            if ( data_count < 0 ) break; /*throw exception_io_data( "Invalid System Exclusive message" );*/
            if ( end - it < data_count ) break;
            buffer.resize( data_count + 1 );
            buffer[ 0 ] = 0xF0;
            std::copy( it, it + data_count, buffer.begin() + 1 );
            it += data_count;
            last_sysex_length = data_count + 1;
            last_sysex_timestamp = current_timestamp;
        }
        else if ( event_code == 0xF7 ) // SysEx continuation
        {
            if ( !last_sysex_length ) break;
            if ( it == end ) break;
            int data_count = decode_delta( it, end );
            if ( data_count < 0 ) break;
            if ( end - it < data_count ) break;
            buffer.resize( last_sysex_length + data_count );
            std::copy( it, it + data_count, buffer.begin() + last_sysex_length );
            it += data_count;
            last_sysex_length += data_count;
        }
        else if ( event_code == 0xFF )
        {
            if ( last_sysex_length )
            {
                track.add_event( midi_event( last_event_timestamp = last_sysex_timestamp, midi_event::extended, 0, &buffer[0], last_sysex_length ) );
                last_sysex_length = 0;
            }

            if ( it == end ) break;
            unsigned char meta_type = *it++;
            if ( it == end ) break;
            int data_count = decode_delta( it, end );
            if ( data_count < 0 ) break; /*throw exception_io_data( "Invalid meta message" );*/
            if ( end - it < data_count ) break;
            buffer.resize( data_count + 2 );
            buffer[ 0 ] = 0xFF;
            buffer[ 1 ] = meta_type;
            std::copy( it, it + data_count, buffer.begin() + 2 );
            it += data_count;
            if ( meta_type == 0x2F )
                current_timestamp = last_event_timestamp;
            else
                last_event_timestamp = current_timestamp;
            track.add_event( midi_event( current_timestamp, midi_event::extended, 0, &buffer[0], data_count + 2 ) );

            if ( meta_type == 0x2F )
            {
                needs_end_marker = true;
                break;
            }
        }
        else if ( event_code >= 0xF8 && event_code <= 0xFE )
        {
            /* Sequencer specific events, single byte */
            buffer[ 0 ] = event_code;
            track.add_event( midi_event( last_event_timestamp = current_timestamp, midi_event::extended, 0, &buffer[0], 1 ) );
        }
        else break; /*throw exception_io_data("Unhandled MIDI status code");*/
    }

    if ( !needs_end_marker )
    {
        buffer[ 0 ] = 0xFF;
        buffer[ 1 ] = 0x2F;
        track.add_event( midi_event( last_event_timestamp, midi_event::extended, 0, &buffer[0], 2 ) );
    }

    p_out.add_track( track );
}